

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

uint32_t __thiscall jbcoin::STObject::getFlags(STObject *this)

{
  int iVar1;
  long lVar2;
  uint32_t uVar3;
  STBase *pSVar4;
  
  iVar1 = getFieldIndex(this,(SField *)sfFlags);
  if (iVar1 == -1) {
    pSVar4 = (STBase *)0x0;
  }
  else {
    pSVar4 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar1].p_;
  }
  uVar3 = 0;
  if (pSVar4 == (STBase *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(pSVar4,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
  }
  if (lVar2 != 0) {
    uVar3 = *(uint32_t *)(lVar2 + 0x10);
  }
  return uVar3;
}

Assistant:

std::uint32_t STObject::getFlags (void) const
{
    const STUInt32* t = dynamic_cast<const STUInt32*> (peekAtPField (sfFlags));

    if (!t)
        return 0;

    return t->value ();
}